

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_create_attr(lyd_node *parent,lyd_attr **attr,ly_ctx *ctx,char *name,size_t name_len,
                      char *prefix,size_t prefix_len,char *module_key,size_t module_key_len,
                      char *value,size_t value_len,ly_bool *dynamic,LY_VALUE_FORMAT format,
                      void *val_prefix_data,uint32_t hints)

{
  lyd_attr *plVar1;
  LY_ERR LVar2;
  lyd_attr *attr_00;
  lyd_attr *plVar3;
  
  if (((ctx == (ly_ctx *)0x0) || (parent == (lyd_node *)0x0 && attr == (lyd_attr **)0x0)) ||
     ((parent != (lyd_node *)0x0 && (parent->schema != (lysc_node *)0x0)))) {
    __assert_fail("ctx && (parent || attr) && (!parent || !parent->schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x591,
                  "LY_ERR lyd_create_attr(struct lyd_node *, struct lyd_attr **, const struct ly_ctx *, const char *, size_t, const char *, size_t, const char *, size_t, const char *, size_t, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t)"
                 );
  }
  if (((name == (char *)0x0) || (name_len == 0)) || (format == LY_VALUE_CANON)) {
    __assert_fail("name && name_len && format",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x592,
                  "LY_ERR lyd_create_attr(struct lyd_node *, struct lyd_attr **, const struct ly_ctx *, const char *, size_t, const char *, size_t, const char *, size_t, const char *, size_t, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t)"
                 );
  }
  if ((value_len == 0) && ((dynamic == (ly_bool *)0x0 || (*dynamic == '\0')))) {
    value = "";
  }
  attr_00 = (lyd_attr *)calloc(1,0x40);
  if (attr_00 == (lyd_attr *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_attr");
    ly_free_prefix_data(format,val_prefix_data);
    return LY_EMEM;
  }
  LVar2 = lydict_insert(ctx,name,name_len,&(attr_00->name).name);
  if (((LVar2 == LY_SUCCESS) &&
      ((prefix_len == 0 ||
       (LVar2 = lydict_insert(ctx,prefix,prefix_len,&(attr_00->name).prefix), LVar2 == LY_SUCCESS)))
      ) && ((module_key_len == 0 ||
            (LVar2 = lydict_insert(ctx,module_key,module_key_len,&(attr_00->name).field_2.module_ns)
            , LVar2 == LY_SUCCESS)))) {
    if ((dynamic == (ly_bool *)0x0) || (*dynamic == '\0')) {
      LVar2 = lydict_insert(ctx,value,value_len,&attr_00->value);
      if (LVar2 == LY_SUCCESS) goto LAB_00121d74;
    }
    else {
      LVar2 = lydict_insert_zc(ctx,value,&attr_00->value);
      if (LVar2 == LY_SUCCESS) {
        *dynamic = '\0';
LAB_00121d74:
        attr_00->format = format;
        attr_00->val_prefix_data = val_prefix_data;
        attr_00->hints = hints;
        if (parent == (lyd_node *)0x0) {
          plVar1 = *attr;
          if (*attr != (lyd_attr *)0x0) {
            do {
              plVar3 = plVar1;
              plVar1 = plVar3->next;
            } while (plVar1 != (lyd_attr *)0x0);
            plVar3->next = attr_00;
          }
        }
        else {
          lyd_insert_attr(parent,attr_00);
        }
        if (attr == (lyd_attr **)0x0) {
          return LY_SUCCESS;
        }
        *attr = attr_00;
        return LY_SUCCESS;
      }
    }
  }
  lyd_free_attr_single(ctx,attr_00);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_create_attr(struct lyd_node *parent, struct lyd_attr **attr, const struct ly_ctx *ctx, const char *name, size_t name_len,
        const char *prefix, size_t prefix_len, const char *module_key, size_t module_key_len, const char *value,
        size_t value_len, ly_bool *dynamic, LY_VALUE_FORMAT format, void *val_prefix_data, uint32_t hints)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_attr *at, *last;

    assert(ctx && (parent || attr) && (!parent || !parent->schema));
    assert(name && name_len && format);

    if (!value_len && (!dynamic || !*dynamic)) {
        value = "";
    }

    at = calloc(1, sizeof *at);
    LY_CHECK_ERR_RET(!at, LOGMEM(ctx); ly_free_prefix_data(format, val_prefix_data), LY_EMEM);

    LY_CHECK_GOTO(ret = lydict_insert(ctx, name, name_len, &at->name.name), finish);
    if (prefix_len) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, prefix, prefix_len, &at->name.prefix), finish);
    }
    if (module_key_len) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, module_key, module_key_len, &at->name.module_ns), finish);
    }

    if (dynamic && *dynamic) {
        ret = lydict_insert_zc(ctx, (char *)value, &at->value);
        LY_CHECK_GOTO(ret, finish);
        *dynamic = 0;
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, value, value_len, &at->value), finish);
    }
    at->format = format;
    at->val_prefix_data = val_prefix_data;
    at->hints = hints;

    /* insert as the last attribute */
    if (parent) {
        lyd_insert_attr(parent, at);
    } else if (*attr) {
        for (last = *attr; last->next; last = last->next) {}
        last->next = at;
    }

finish:
    if (ret) {
        lyd_free_attr_single(ctx, at);
    } else if (attr) {
        *attr = at;
    }
    return LY_SUCCESS;
}